

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeImpl.cpp
# Opt level: O0

DOMNode * __thiscall xercesc_4_0::DOMNodeImpl::getTreeParentNode(DOMNodeImpl *this,DOMNode *node)

{
  short sVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  short nodeType;
  DOMNode *parent;
  DOMNode *node_local;
  DOMNodeImpl *this_local;
  
  iVar2 = (*node->_vptr_DOMNode[5])();
  this_local = (DOMNodeImpl *)CONCAT44(extraout_var,iVar2);
  if (this_local == (DOMNodeImpl *)0x0) {
    iVar2 = (*node->_vptr_DOMNode[4])();
    sVar1 = (short)iVar2;
    if (sVar1 == 2) {
      iVar2 = (*node->_vptr_DOMNode[0x2c])();
      this_local = (DOMNodeImpl *)CONCAT44(extraout_var_00,iVar2);
    }
    else if ((sVar1 == 6) || (sVar1 == 0xc)) {
      iVar2 = (*node->_vptr_DOMNode[0xc])();
      this_local = (DOMNodeImpl *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x58))();
    }
    else {
      this_local = (DOMNodeImpl *)0x0;
    }
  }
  return (DOMNode *)this_local;
}

Assistant:

const DOMNode*   DOMNodeImpl::getTreeParentNode(const DOMNode* node) const {
    const DOMNode* parent=node->getParentNode();
    if(parent)
        return parent;
    short nodeType=node->getNodeType();
    switch(nodeType)
    {
    case DOMNode::ATTRIBUTE_NODE: return ((const DOMAttr*)node)->getOwnerElement();
    case DOMNode::NOTATION_NODE:
    case DOMNode::ENTITY_NODE:    return node->getOwnerDocument()->getDoctype();
    }
    return 0;
}